

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
mjs::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,source_extend *extend)

{
  source_extend *psVar1;
  element_type *peVar2;
  type *sp;
  wchar_t *__beg;
  wchar_t *__end;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  wstring_view fn;
  type *end_pos;
  type *start_pos;
  pair<mjs::source_position,_mjs::source_position> local_28;
  source_extend *local_18;
  source_extend *extend_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  local_18 = extend;
  extend_local = (source_extend *)os;
  peVar2 = std::__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)extend);
  _start_pos = source_file::text(peVar2);
  local_28 = extend_to_positions((wstring_view *)&start_pos,local_18->start,local_18->end);
  sp = std::get<0ul,mjs::source_position,mjs::source_position>(&local_28);
  fn._M_str = &std::get<1ul,mjs::source_position,mjs::source_position>(&local_28)->line;
  peVar2 = std::__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  _local_58 = source_file::filename(peVar2);
  psVar1 = extend_local;
  __beg = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_58);
  __end = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<wchar_t_const*,void>(local_78,__beg,__end,&local_79);
  std::operator<<((ostream *)psVar1,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  poVar3 = std::operator<<((ostream *)extend_local,":");
  pbVar4 = operator<<(poVar3,sp);
  poVar3 = std::operator<<(pbVar4,"-");
  pbVar4 = operator<<(poVar3,(source_position *)fn._M_str);
  return pbVar4;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const source_extend& extend) {
        auto [start_pos, end_pos] = extend_to_positions(extend.file->text(), extend.start, extend.end);
        if constexpr (sizeof(CharT) == 1) {
            const auto fn = extend.file->filename();
            os << std::string(fn.begin(), fn.end());
        } else {
            os << extend.file->filename();
        }
        return os << ":" << start_pos << "-" << end_pos;
    }